

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qiterable.h
# Opt level: O2

QConstIterator<QMetaAssociation> * __thiscall
QConstIterator<QMetaAssociation>::operator++(QConstIterator<QMetaAssociation> *this)

{
  long in_FS_OFFSET;
  QMetaContainer local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_18.d_ptr =
       *(QMetaContainerInterface **)
        (((this->super_QBaseIterator<QMetaAssociation>).m_iterable.m_pointer.d & 0xfffffffffffffff8)
        + 0x10);
  QMetaContainer::advanceConstIterator
            (&local_18,(this->super_QBaseIterator<QMetaAssociation>).m_iterator,1);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QConstIterator &operator++()
    {
        this->metaContainer().advanceConstIterator(this->mutableIterator(), 1);
        return *this;
    }